

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_comparison.cpp
# Opt level: O1

bool duckdb::AreMatchesPossible(LogicalType *left,LogicalType *right)

{
  idx_t iVar1;
  idx_t iVar2;
  Vector *pVVar3;
  int64_t iVar4;
  ulong uVar5;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  LogicalType *type;
  bool bVar8;
  bool bVar9;
  string key;
  anon_union_16_2_67f50693_for_value local_68;
  char (*local_58 [2]) [4];
  char local_48 [16];
  LogicalType *local_38;
  
  iVar1 = EnumType::GetSize(left);
  iVar2 = EnumType::GetSize(right);
  type = right;
  local_38 = left;
  if (iVar1 < iVar2) {
    type = left;
    local_38 = right;
  }
  pVVar3 = EnumType::GetValuesInsertOrder(type);
  pdVar7 = pVVar3->data;
  iVar1 = EnumType::GetSize(type);
  bVar8 = iVar1 != 0;
  if (bVar8) {
    pdVar7 = pdVar7 + 4;
    uVar5 = 1;
    do {
      pdVar6 = pdVar7;
      if (0xc < (ulong)*(uint *)(pdVar7 + -4)) {
        pdVar6 = *(data_ptr_t *)(pdVar7 + 4);
      }
      local_58[0] = (char (*) [4])local_48;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,pdVar6,pdVar6 + *(uint *)(pdVar7 + -4));
      local_68.pointer.length = (uint32_t)local_58[1];
      if (local_68.pointer.length < 0xd) {
        local_68._12_4_ = 0;
        local_68.pointer.prefix[0] = '\0';
        local_68.pointer.prefix[1] = '\0';
        local_68.pointer.prefix[2] = '\0';
        local_68.pointer.prefix[3] = '\0';
        local_68._8_4_ = 0;
        if (local_68.pointer.length != 0) {
          switchD_00b1422a::default
                    (local_68.pointer.prefix,local_58[0],(ulong)(local_68.pointer.length & 0xf));
        }
      }
      else {
        local_68.pointer.prefix = *local_58[0];
        local_68._8_4_ = SUB84(local_58[0],0);
        local_68._12_4_ = (undefined4)((ulong)local_58[0] >> 0x20);
      }
      iVar4 = EnumType::GetPos(local_38,(string_t *)&local_68.pointer);
      if (local_58[0] != (char (*) [4])local_48) {
        operator_delete(local_58[0]);
      }
      if (iVar4 != -1) {
        return bVar8;
      }
      bVar8 = uVar5 < iVar1;
      pdVar7 = pdVar7 + 0x10;
      bVar9 = uVar5 != iVar1;
      uVar5 = uVar5 + 1;
    } while (bVar9);
  }
  return bVar8;
}

Assistant:

bool AreMatchesPossible(LogicalType &left, LogicalType &right) {
	LogicalType *small_enum, *big_enum;
	if (EnumType::GetSize(left) < EnumType::GetSize(right)) {
		small_enum = &left;
		big_enum = &right;
	} else {
		small_enum = &right;
		big_enum = &left;
	}
	auto &string_vec = EnumType::GetValuesInsertOrder(*small_enum);
	auto string_vec_ptr = FlatVector::GetData<string_t>(string_vec);
	auto size = EnumType::GetSize(*small_enum);
	for (idx_t i = 0; i < size; i++) {
		auto key = string_vec_ptr[i].GetString();
		if (EnumType::GetPos(*big_enum, key) != -1) {
			return true;
		}
	}
	return false;
}